

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  string sVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  string *psVar6;
  ulong uVar7;
  void **ppvVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Dd;
  int out_size;
  void *out;
  ChunkIterator CStack_100;
  CopyingOutputStreamAdaptor *pCStack_60;
  void *pvStack_58;
  ulong uStack_50;
  int local_44;
  void *local_40 [2];
  
  uVar7 = (ulong)(uint)size;
  if (size < this->buffer_size_) {
    uStack_50 = 0x16becc;
    iVar4 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                      (this,local_40,&local_44);
    cVar3 = (char)iVar4;
    if (cVar3 != '\0') {
      if (local_44 < size) {
        do {
          uStack_50 = 0x16bef4;
          memcpy(local_40[0],data,(long)local_44);
          iVar4 = local_44;
          lVar9 = (long)local_44;
          uStack_50 = 0x16bf0a;
          iVar5 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                            (this,local_40,&local_44);
          cVar3 = (char)iVar5;
          if (cVar3 == '\0') {
            return false;
          }
          size = (int)uVar7 - iVar4;
          uVar7 = (ulong)(uint)size;
          data = (void *)((long)data + lVar9);
        } while (local_44 < size);
      }
      uStack_50 = 0x16bf32;
      memcpy(local_40[0],data,(long)size);
      uStack_50 = 0x16bf42;
      (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                (this,(ulong)(uint)(local_44 - size));
    }
  }
  else {
    uStack_50 = 0x16bf4c;
    bVar2 = WriteBuffer(this);
    if (bVar2) {
      uStack_50 = 0x16bf5f;
      iVar4 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                        (this->copying_stream_,data,uVar7);
      if ((char)iVar4 != '\0') {
        if ((long)this->buffer_used_ == 0) {
          psVar6 = (string *)0x0;
        }
        else {
          uStack_50 = 0x16bfa2;
          psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             ((long)this->buffer_used_,0,"buffer_used_ == 0");
        }
        if (psVar6 == (string *)0x0) {
          this->position_ = this->position_ + (long)size;
          return true;
        }
        ppvVar8 = local_40;
        uStack_50 = 0x16bfb1;
        WriteAliasedRaw();
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        CStack_100.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
        CStack_100.bytes_remaining_ = 0;
        CStack_100.current_chunk_ = (string_view)ZEXT816(0);
        CStack_100.btree_reader_.remaining_ = 0;
        CStack_100.btree_reader_.navigator_.height_ = -1;
        sVar1 = *psVar6;
        tree = *(Nonnull<cord_internal::CordRep_*> *)(psVar6 + 8);
        pCStack_60 = this;
        pvStack_58 = data;
        uStack_50 = uVar7;
        if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)sVar1 & 1U) == 0) {
          if (((byte)sVar1 & 1) != 0) goto LAB_0016c0db;
          CStack_100.bytes_remaining_ = (ulong)(long)(char)sVar1 >> 1;
          CStack_100.current_chunk_._M_str = (char *)(psVar6 + 1);
          CStack_100.current_chunk_._M_len = CStack_100.bytes_remaining_;
        }
        else {
          CStack_100.bytes_remaining_ = tree->length;
          if (CStack_100.bytes_remaining_ == 0) goto LAB_0016c0e0;
          absl::lts_20240722::Cord::ChunkIterator::InitTree(&CStack_100,tree);
        }
        do {
          bVar2 = CStack_100.bytes_remaining_ == 0;
          if (bVar2) {
            return bVar2;
          }
          cVar3 = (**(code **)((long)*ppvVar8 + 0x28))
                            (ppvVar8,CStack_100.current_chunk_._M_str,
                             (undefined4)CStack_100.current_chunk_._M_len);
          if (cVar3 == '\0') {
            return bVar2;
          }
          while (CStack_100.bytes_remaining_ != 0) {
            uVar7 = CStack_100.bytes_remaining_ - CStack_100.current_chunk_._M_len;
            if (CStack_100.bytes_remaining_ < CStack_100.current_chunk_._M_len) {
              __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                            ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
            }
            CStack_100.bytes_remaining_ = uVar7;
            if (uVar7 != 0) {
              if (((long)CStack_100.btree_reader_.navigator_.height_ < 0) ||
                 (CStack_100.btree_reader_.navigator_.node_
                  [CStack_100.btree_reader_.navigator_.height_] == (CordRepBtree *)0x0)) {
                if (CStack_100.current_chunk_._M_len == 0) {
                  __assert_fail("!current_chunk_.empty()",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                                ,0x621,
                                "Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
                }
                CStack_100.current_chunk_ = (string_view)ZEXT816(0);
              }
              else {
                CStack_100.current_chunk_ =
                     absl::lts_20240722::cord_internal::CordRepBtreeReader::Next
                               (&CStack_100.btree_reader_);
              }
            }
            bVar2 = CStack_100.bytes_remaining_ == 0;
            if (bVar2) {
              return bVar2;
            }
            cVar3 = (**(code **)((long)*ppvVar8 + 0x28))
                              (ppvVar8,CStack_100.current_chunk_._M_str,
                               (undefined4)CStack_100.current_chunk_._M_len);
            if (cVar3 == '\0') {
              return bVar2;
            }
          }
          WriteCord();
LAB_0016c0db:
          WriteCord();
          uVar10 = extraout_XMM0_Da;
          uVar11 = extraout_XMM0_Db;
          uVar12 = extraout_XMM0_Dc;
          uVar13 = extraout_XMM0_Dd;
LAB_0016c0e0:
          CStack_100.current_chunk_._M_len._4_4_ = uVar11;
          CStack_100.current_chunk_._M_len._0_4_ = uVar10;
          CStack_100.current_chunk_._M_str._0_4_ = uVar12;
          CStack_100.current_chunk_._M_str._4_4_ = uVar13;
        } while( true );
      }
    }
    cVar3 = '\0';
  }
  return (bool)cVar3;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    ABSL_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      return true;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}